

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

bool Js::JavascriptRegExp::HasObservableGlobalFlag(DynamicObject *regexPrototype)

{
  bool bVar1;
  int index;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  JavascriptFunction *pJVar2;
  JavascriptFunction *pJVar3;
  undefined1 local_19;
  JavascriptLibrary *library;
  DynamicObject *regexPrototype_local;
  
  this = RecyclableObject::GetLibrary(&regexPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&regexPrototype->super_RecyclableObject);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01);
  local_19 = false;
  if (bVar1) {
    index = JavascriptLibrary::GetRegexGlobalGetterSlotIndex(this);
    pJVar2 = (JavascriptFunction *)DynamicObject::GetSlot(regexPrototype,index);
    pJVar3 = JavascriptLibrary::GetRegexGlobalGetterFunction(this);
    local_19 = pJVar2 != pJVar3;
  }
  return local_19;
}

Assistant:

bool JavascriptRegExp::HasObservableGlobalFlag(DynamicObject* regexPrototype)
    {
        JavascriptLibrary* library = regexPrototype->GetLibrary();
        return regexPrototype->GetScriptContext()->GetConfig()->IsES6RegExPrototypePropertiesEnabled()
            && regexPrototype->GetSlot(library->GetRegexGlobalGetterSlotIndex()) != library->GetRegexGlobalGetterFunction();
    }